

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Stack::mark(Stack *this,Heap *heap)

{
  bool bVar1;
  long in_RDI;
  Frame *f;
  iterator __end3;
  iterator __begin3;
  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *__range3;
  Heap *in_stack_00000048;
  Frame *in_stack_00000050;
  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::Frame_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RDI + 0x10;
  local_20._M_current =
       (Frame *)std::
                vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::Frame_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<jsonnet::internal::(anonymous_namespace)::Frame_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::(anonymous_namespace)::Frame_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>_>
         ::operator*(&local_20);
    Frame::mark(in_stack_00000050,in_stack_00000048);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::(anonymous_namespace)::Frame_*,_std::vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void mark(Heap &heap)
    {
        for (const auto &f : stack) {
            f.mark(heap);
        }
    }